

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationDataBuilder::encodeExpansion
          (CollationDataBuilder *this,int64_t *ces,int32_t length,UErrorCode *errorCode)

{
  long lVar1;
  UBool UVar2;
  int32_t iVar3;
  uint32_t uVar4;
  int64_t iVar5;
  int local_4c;
  int32_t j_1;
  int32_t i;
  int32_t j;
  int32_t i_1;
  int32_t ce64sMax;
  int64_t first;
  UErrorCode *errorCode_local;
  int32_t length_local;
  int64_t *ces_local;
  CollationDataBuilder *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    lVar1 = *ces;
    iVar3 = UVector64::size(&this->ce64s);
    for (i = 0; i <= iVar3 - length; i = i + 1) {
      iVar5 = UVector64::elementAti(&this->ce64s,i);
      if (lVar1 == iVar5) {
        if (0x7ffff < i) {
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
          return 0;
        }
        j_1 = 1;
        while( true ) {
          if (j_1 == length) {
            uVar4 = Collation::makeCE32FromTagIndexAndLength(6,i,length);
            return uVar4;
          }
          iVar5 = UVector64::elementAti(&this->ce64s,i + j_1);
          if (iVar5 != ces[j_1]) break;
          j_1 = j_1 + 1;
        }
      }
    }
    iVar3 = UVector64::size(&this->ce64s);
    if (iVar3 < 0x80000) {
      for (local_4c = 0; local_4c < length; local_4c = local_4c + 1) {
        UVector64::addElement(&this->ce64s,ces[local_4c],errorCode);
      }
      this_local._4_4_ = Collation::makeCE32FromTagIndexAndLength(6,iVar3,length);
    }
    else {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationDataBuilder::encodeExpansion(const int64_t ces[], int32_t length, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    // See if this sequence of CEs has already been stored.
    int64_t first = ces[0];
    int32_t ce64sMax = ce64s.size() - length;
    for(int32_t i = 0; i <= ce64sMax; ++i) {
        if(first == ce64s.elementAti(i)) {
            if(i > Collation::MAX_INDEX) {
                errorCode = U_BUFFER_OVERFLOW_ERROR;
                return 0;
            }
            for(int32_t j = 1;; ++j) {
                if(j == length) {
                    return Collation::makeCE32FromTagIndexAndLength(
                            Collation::EXPANSION_TAG, i, length);
                }
                if(ce64s.elementAti(i + j) != ces[j]) { break; }
            }
        }
    }
    // Store the new sequence.
    int32_t i = ce64s.size();
    if(i > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 0;
    }
    for(int32_t j = 0; j < length; ++j) {
        ce64s.addElement(ces[j], errorCode);
    }
    return Collation::makeCE32FromTagIndexAndLength(Collation::EXPANSION_TAG, i, length);
}